

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprogressdialog.cpp
# Opt level: O0

void __thiscall QProgressDialogPrivate::ensureSizeIsAtLeastSizeHint(QProgressDialogPrivate *this)

{
  long lVar1;
  bool bVar2;
  QSize *otherSize;
  QProgressDialogPrivate *in_RDI;
  long in_FS_OFFSET;
  QSize *unaff_retaddr;
  QProgressDialog *q;
  QSize size;
  QWidget *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  otherSize = (QSize *)q_func(in_RDI);
  (**(code **)((long)*otherSize + 0x70))();
  bVar2 = QWidget::isVisible((QWidget *)0x7b15e0);
  if (bVar2) {
    QWidget::size(in_stack_ffffffffffffffc8);
    QSize::expandedTo((QSize *)in_RDI,otherSize);
  }
  QWidget::resize((QWidget *)q,unaff_retaddr);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QProgressDialogPrivate::ensureSizeIsAtLeastSizeHint()
{
    Q_Q(QProgressDialog);

    QSize size = q->sizeHint();
    if (q->isVisible())
        size = size.expandedTo(q->size());
    q->resize(size);
}